

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::local_name(xpath_node *node)

{
  xml_node_struct *pxVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pxVar1 = (xml_node_struct *)(node->_attribute)._attr;
  pcVar4 = "";
  if (((pxVar1 != (xml_node_struct *)0x0) ||
      (pxVar1 = (node->_node)._root, pxVar1 != (xml_node_struct *)0x0)) &&
     (pxVar1->name != (char *)0x0)) {
    pcVar4 = pxVar1->name;
  }
  pcVar2 = strchr(pcVar4,0x3a);
  pcVar3 = pcVar2 + 1;
  if (pcVar2 == (char *)0x0) {
    pcVar3 = pcVar4;
  }
  return pcVar3;
}

Assistant:

PUGI_IMPL_FN xml_attribute xpath_node::attribute() const
	{
		return _attribute;
	}